

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getReducedColumn
          (Highs *this,HighsInt col,double *col_vector,HighsInt *col_num_nz,HighsInt *col_indices)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  ulong uVar5;
  HighsStatus HVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> local_68;
  value_type_conflict1 local_50;
  string local_48;
  
  uVar5 = (ulong)(uint)col;
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  if (col_vector == (double *)0x0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getReducedColumn: col_vector is NULL\n");
  }
  else {
    iVar1 = (this->model_).lp_.num_col_;
    if (-1 < col && col < iVar1) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_50 = 0.0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (&local_68,(long)(this->model_).lp_.num_row_,&local_50);
        piVar3 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar1 = piVar3[uVar5];
        lVar7 = (long)iVar1;
        iVar2 = piVar3[uVar5 + 1];
        if (iVar1 < iVar2) {
          piVar3 = (this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar4 = (this->model_).lp_.a_matrix_.value_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[piVar3[lVar7]] = pdVar4[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar2 != lVar7);
        }
        basisSolveInterface(this,&local_68,col_vector,col_num_nz,col_indices,false);
        if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return kOk;
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"getReducedColumn","");
      HVar6 = invertRequirementError(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return HVar6;
      }
      operator_delete(local_48._M_dataplus._M_p);
      return HVar6;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Column index %d out of range [0, %d] in getReducedColumn\n",uVar5,
                 (ulong)(iVar1 - 1));
  }
  return kError;
}

Assistant:

HighsStatus Highs::getReducedColumn(const HighsInt col, double* col_vector,
                                    HighsInt* col_num_nz,
                                    HighsInt* col_indices) {
  HighsLp& lp = model_.lp_;
  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (col_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getReducedColumn: col_vector is NULL\n");
    return HighsStatus::kError;
  }
  // col_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  if (col < 0 || col >= lp.num_col_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Column index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT
                 "] in getReducedColumn\n",
                 col, lp.num_col_ - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getReducedColumn");
  HighsInt num_row = lp.num_row_;
  vector<double> rhs;
  rhs.assign(num_row, 0);
  for (HighsInt el = lp.a_matrix_.start_[col];
       el < lp.a_matrix_.start_[col + 1]; el++)
    rhs[lp.a_matrix_.index_[el]] = lp.a_matrix_.value_[el];
  basisSolveInterface(rhs, col_vector, col_num_nz, col_indices, false);
  return HighsStatus::kOk;
}